

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O2

bool __thiscall teetime::Image::saveToFile(Image *this,string *filename,ImageFileFormat format)

{
  int iVar1;
  
  if (format == Png) {
    iVar1 = stbi_write_png((filename->_M_dataplus)._M_p,(int)this->m_width,(int)this->m_height,4,
                           this->m_data,0);
    return iVar1 != 0;
  }
  if (format != Bmp) {
    if (format != Tga) {
      return false;
    }
    iVar1 = stbi_write_tga((filename->_M_dataplus)._M_p,(int)this->m_width,(int)this->m_height,4,
                           this->m_data);
    return iVar1 != 0;
  }
  iVar1 = stbi_write_bmp((filename->_M_dataplus)._M_p,(int)this->m_width,(int)this->m_height,4,
                         this->m_data);
  return iVar1 != 0;
}

Assistant:

bool Image::saveToFile(const std::string& filename, ImageFileFormat format) const
{
  switch (format)
  {
  case ImageFileFormat::Tga:
    return saveToTgaFile(filename);
  case ImageFileFormat::Bmp:
    return saveToBmpFile(filename);
  case ImageFileFormat::Png:
    return saveToPngFile(filename);
  default:
    return false;
  }
}